

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

void __thiscall FStateDefinitions::AddStateDefines(FStateDefinitions *this,FStateLabels *list)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  FStateDefine local_58;
  
  if (list != (FStateLabels *)0x0) {
    iVar1 = list->NumLabels;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (list->Labels[lVar2].Children == (FStateLabels *)0x0) {
          local_58.Label.Index = list->Labels[lVar2].Label.Index;
          uVar3 = (ulong)(this->StateLabels).Count;
          if (uVar3 != 0) {
            lVar4 = 0;
            do {
              if (*(int *)((long)&(((this->StateLabels).Array)->Label).Index + lVar4) ==
                  local_58.Label.Index) goto LAB_00455bc6;
              lVar4 = lVar4 + 0x28;
            } while (uVar3 * 0x28 != lVar4);
          }
          local_58.Children.Array = (FStateDefine *)0x0;
          local_58.Children.Most = 0;
          local_58.Children.Count = 0;
          local_58.State = list->Labels[lVar2].State;
          local_58.DefineFlags = '\x01';
          TArray<FStateDefine,_FStateDefine>::Push(&this->StateLabels,&local_58);
          TArray<FStateDefine,_FStateDefine>::~TArray(&local_58.Children);
          iVar1 = list->NumLabels;
        }
LAB_00455bc6:
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
  }
  return;
}

Assistant:

void FStateDefinitions::AddStateDefines(const FStateLabels *list)
{
	if (list != NULL) for(int i = 0; i < list->NumLabels; i++)
	{
		if (list->Labels[i].Children == NULL)
		{
			if (!FindStateLabelInList(StateLabels, list->Labels[i].Label, false))
			{
				FStateDefine def;

				def.Label = list->Labels[i].Label;
				def.State = list->Labels[i].State;
				def.DefineFlags = SDF_STATE;
				StateLabels.Push(def);
			}
		}
	}
}